

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect.c
# Opt level: O2

void print_valtypes(wasm_valtype_vec_t *types)

{
  bool bVar1;
  size_t i;
  ulong uVar2;
  
  bVar1 = true;
  for (uVar2 = 0; uVar2 < types->size; uVar2 = uVar2 + 1) {
    if (!bVar1) {
      putchar(0x20);
    }
    print_valtype(types->data[uVar2]);
    bVar1 = false;
  }
  return;
}

Assistant:

void print_valtypes(const wasm_valtype_vec_t* types) {
  bool first = true;
  for (size_t i = 0; i < types->size; ++i) {
    if (first) {
      first = false;
    } else {
      printf(" ");
    }
    print_valtype(types->data[i]);
  }
}